

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricCurveSet::IfcGeometricCurveSet(IfcGeometricCurveSet *this)

{
  IfcGeometricCurveSet *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcGeometricSet).field_0x58,"IfcGeometricCurveSet");
  IfcGeometricSet::IfcGeometricSet
            (&this->super_IfcGeometricSet,&PTR_construction_vtable_24__00e9d5d8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricCurveSet,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricCurveSet,_0UL> *)
             &(this->super_IfcGeometricSet).field_0x48,&PTR_construction_vtable_24__00e9d650);
  (this->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xe9d520;
  *(undefined8 *)&(this->super_IfcGeometricSet).field_0x58 = 0xe9d5c0;
  *(undefined8 *)
   &(this->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xe9d548;
  *(undefined8 *)
   &(this->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xe9d570;
  *(undefined8 *)&(this->super_IfcGeometricSet).field_0x48 = 0xe9d598;
  return;
}

Assistant:

IfcGeometricCurveSet() : Object("IfcGeometricCurveSet") {}